

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

_Bool chck_buffer_read_string_of_type(char **str,size_t *out_len,chck_bits bits,chck_buffer *buf)

{
  uint8_t *__src;
  _Bool _Var1;
  char *__dest;
  uint8_t *__n;
  size_t nsz;
  uint8_t *puVar2;
  chck_variant v;
  uint8_t *local_40;
  chck_bits local_38;
  
  if ((str == (char **)0x0) || (buf == (chck_buffer *)0x0)) {
    __assert_fail("buf && str",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/buffer.c"
                  ,0x131,
                  "_Bool chck_buffer_read_string_of_type(char **, size_t *, enum chck_bits, struct chck_buffer *)"
                 );
  }
  *str = (char *)0x0;
  if (out_len != (size_t *)0x0) {
    *out_len = 0;
  }
  local_40 = (uint8_t *)0x0;
  local_38 = bits;
  _Var1 = chck_buffer_read_int(&local_40,bits,buf);
  if (_Var1) {
    puVar2 = local_40;
    switch(local_38) {
    case CHCK_BUFFER_B8:
      puVar2 = (uint8_t *)((ulong)local_40 & 0xff);
      break;
    case CHCK_BUFFER_B16:
      puVar2 = (uint8_t *)((ulong)local_40 & 0xffff);
      break;
    default:
      __assert_fail("0 && \"should not happen\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/buffer.c"
                    ,0x45,"uintmax_t variant_get_value(struct chck_variant)");
    case CHCK_BUFFER_B32:
      puVar2 = (uint8_t *)((ulong)local_40 & 0xffffffff);
      break;
    case CHCK_BUFFER_B64:
      break;
    }
    if (out_len != (size_t *)0x0) {
      *out_len = (size_t)puVar2;
    }
    if (puVar2 == (uint8_t *)0x0) {
      return true;
    }
    if (puVar2 + 1 == (uint8_t *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      __dest = (char *)calloc(1,(size_t)(puVar2 + 1));
    }
    *str = __dest;
    if (__dest != (char *)0x0) {
      __src = buf->curpos;
      __n = puVar2;
      if (buf->buffer + (buf->size - (long)__src) < puVar2) {
        __n = buf->buffer + (buf->size - (long)__src);
      }
      memcpy(__dest,__src,(size_t)__n);
      buf->curpos = __src + (long)__n;
      if (__n == puVar2) {
        return true;
      }
      free(*str);
    }
  }
  return false;
}

Assistant:

bool
chck_buffer_read_string_of_type(char **str, size_t *out_len, enum chck_bits bits, struct chck_buffer *buf)
{
   assert(buf && str);
   *str = NULL;

   if (out_len)
      *out_len = 0;

   struct chck_variant v = { .bits = bits };
   if (unlikely(!chck_buffer_read_int(v.b, bits, buf)))
      return false;

   const size_t len = variant_get_value(v);

   if (out_len)
      *out_len = len;

   if (len <= 0)
      return true;

   if (!(*str = chck_calloc_add_of(len, 1)))
      return false;

   if (unlikely(chck_buffer_read(*str, 1, len, buf) != len)) {
      free(*str);
      return false;
   }

   return true;
}